

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree.hpp
# Opt level: O1

int __thiscall NodeBTree::lessThanKeyCompareOp(NodeBTree *this,KeyType *key,uint8_t *data)

{
  ulong uVar1;
  ulong uVar2;
  byte *pbVar3;
  ulong uVar4;
  
  uVar4 = (ulong)*data;
  if ((char)*data < '\0') {
    pbVar3 = data + 1;
    uVar2 = 0x80;
    do {
      uVar1 = (uVar4 - uVar2) * 0x100;
      uVar4 = *pbVar3 | uVar1;
      uVar2 = uVar2 << 7;
      pbVar3 = pbVar3 + 1;
    } while ((uVar1 & uVar2) != 0);
  }
  return -(uint)(key->m_nodeIndex < (uint)uVar4) | 1;
}

Assistant:

static inline uint64_t decodeBitsAndAdvance(const uint8_t*& data)
{
	uint64_t value = *data++;
	uint64_t mask = 0x80;
	while (value & mask) {
		value = ((value - mask) << 8) | (*data++);
		mask <<= 7;
	}
	return value;
}